

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O2

void __thiscall Book::Book(Book *this,string *name,double price)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)name);
  Product::Product(&this->super_Product,&local_30,price);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Product)._vptr_Product = (_func_int **)&PTR_printProperties_0010fb48;
  (this->author)._M_dataplus._M_p = (pointer)&(this->author).field_2;
  (this->author)._M_string_length = 0;
  (this->author).field_2._M_local_buf[0] = '\0';
  (this->publisher)._M_dataplus._M_p = (pointer)&(this->publisher).field_2;
  (this->publisher)._M_string_length = 0;
  (this->publisher).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Book::Book(string name, double price):Product(name,price){

}